

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O1

ptr<resp_msg> __thiscall nuraft::FakeNetwork::gotMsg(FakeNetwork *this,ptr<req_msg> *msg)

{
  element_type *peVar1;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ptr<resp_msg> pVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  peVar1 = msg[5].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  (*(peVar1->super_msg_base)._vptr_msg_base[2])(this,peVar1,*in_RDX);
  _Var2._M_pi = extraout_RDX;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar3.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> FakeNetwork::gotMsg(ptr<req_msg>& msg) {
    ptr<resp_msg> resp = raft_server_handler::process_req(handler.get(), *msg);
    return resp;
}